

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeDumper.cpp
# Opt level: O0

void Js::ByteCodeDumper::
     DumpElementSlotI1<Js::OpLayoutT_ElementSlotI1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
               (OpCode op,OpLayoutT_ElementSlotI1<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *data,
               FunctionBody *dumpFunction,ByteCodeReader *reader)

{
  ushort uVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  FunctionProxy *this;
  ParseableFunctionInfo *pPVar5;
  undefined4 extraout_var;
  undefined4 *puVar6;
  FunctionProxy *pfuncActual;
  ByteCodeReader *reader_local;
  FunctionBody *dumpFunction_local;
  OpLayoutT_ElementSlotI1<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *data_local;
  OpCode op_local;
  
  if (op == LdLocalSlot) {
LAB_00b23b29:
    Output::Print(L" R%d = [%d] ",(ulong)data->Value,(ulong)data->SlotIndex);
  }
  else {
    if (op != StLocalSlot) {
      if ((ushort)(op - NewScFunc) < 3) {
        this = ParseableFunctionInfo::GetNestedFunctionProxy
                         (&dumpFunction->super_ParseableFunctionInfo,(uint)data->SlotIndex);
        uVar1 = data->Value;
        pPVar5 = FunctionProxy::EnsureDeserialized(this);
        iVar4 = (*(pPVar5->super_FunctionProxy).super_FinalizableObject.super_IRecyclerVisitedObject
                  ._vptr_IRecyclerVisitedObject[7])();
        Output::Print(L" R%d = %s()",(ulong)uVar1,CONCAT44(extraout_var,iVar4));
        return;
      }
      if (((((ushort)(op - LdEnvObj) < 2) || (op == LdParamSlot)) || (op == LdLocalObjSlot)) ||
         (op == LdParamObjSlot)) goto LAB_00b23b29;
      if (((op != StParamSlot) && (1 < (ushort)(op - StLocalSlotChkUndecl))) &&
         (2 < (ushort)(op - StLocalObjSlot) && op != StParamObjSlotChkUndecl)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeDumper.cpp"
                                    ,0x395,"(false)","Unknown OpCode for OpLayoutElementSlotI1");
        if (bVar3) {
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 0;
          return;
        }
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
    }
    Output::Print(L" [%d] = R%d ",(ulong)data->SlotIndex,(ulong)data->Value);
  }
  return;
}

Assistant:

void ByteCodeDumper::DumpElementSlotI1(OpCode op, const unaligned T * data, Js::FunctionBody * dumpFunction, ByteCodeReader& reader)
    {
        switch (op)
        {
            case OpCode::StLocalSlot:
            case OpCode::StParamSlot:
            case OpCode::StLocalObjSlot:
            case OpCode::StParamObjSlot:
            case OpCode::StLocalSlotChkUndecl:
            case OpCode::StParamSlotChkUndecl:
            case OpCode::StLocalObjSlotChkUndecl:
            case OpCode::StParamObjSlotChkUndecl:
                Output::Print(_u(" [%d] = R%d "),data->SlotIndex, data->Value);
                break;
            case OpCode::LdLocalSlot:
            case OpCode::LdParamSlot:
            case OpCode::LdEnvObj:
            case OpCode::LdEnvObj_ReuseLoc:
            case OpCode::LdLocalObjSlot:
            case OpCode::LdParamObjSlot:
                Output::Print(_u(" R%d = [%d] "), data->Value, data->SlotIndex);
                break;
            case OpCode::NewScFunc:
            case OpCode::NewStackScFunc:
            case OpCode::NewScGenFunc:
            {
                FunctionProxy* pfuncActual = dumpFunction->GetNestedFunctionProxy((uint)data->SlotIndex);
                Output::Print(_u(" R%d = %s()"), data->Value,
                        pfuncActual->EnsureDeserialized()->GetDisplayName());
                break;
            }
            default:
            {
                AssertMsg(false, "Unknown OpCode for OpLayoutElementSlotI1");
                break;
            }
        }
    }